

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int IoCommandReadVerilog(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint fBarBufs;
  int iVar1;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  char *pcVar3;
  uint fCheck;
  
  glo_fMapped = 0;
  fBarBufs = 0;
  Extra_UtilGetoptReset();
  fCheck = 1;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"mcbh"), iVar1 == 0x6d) {
      glo_fMapped = glo_fMapped ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 == 0x62) {
      fBarBufs = fBarBufs ^ 1;
    }
    else {
      if (iVar1 != 99) goto LAB_0028be9c;
      fCheck = fCheck ^ 1;
    }
  }
  if (globalUtilOptind + 1 == argc) {
    pNtk = Io_Read(argv[globalUtilOptind],IO_FILE_VERILOG,fCheck,fBarBufs);
    if (pNtk == (Abc_Ntk_t *)0x0) {
      return 1;
    }
    Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
    Abc_FrameClearVerifStatus(pAbc);
    return 0;
  }
LAB_0028be9c:
  fwrite("usage: read_verilog [-mcbh] <file>\n",0x23,1,(FILE *)pAbc->Err);
  fwrite("\t         reads the network in Verilog (IWLS 2002/2005 subset)\n",0x3f,1,
         (FILE *)pAbc->Err);
  pcVar3 = "yes";
  pcVar2 = "yes";
  if (glo_fMapped == 0) {
    pcVar2 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-m     : toggle reading mapped Verilog [default = %s]\n",pcVar2);
  pcVar2 = "yes";
  if (fCheck == 0) {
    pcVar2 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-c     : toggle network check after reading [default = %s]\n",pcVar2)
  ;
  if (fBarBufs == 0) {
    pcVar3 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-b     : toggle reading barrier buffers [default = %s]\n",pcVar3);
  fwrite("\t-h     : prints the command summary\n",0x25,1,(FILE *)pAbc->Err);
  fwrite("\tfile   : the name of a file to read\n",0x25,1,(FILE *)pAbc->Err);
  return 1;
}

Assistant:

int IoCommandReadVerilog( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    char * pFileName;
    int fCheck, fBarBufs;
    int c;

    fCheck = 1;
    fBarBufs = 0;
    glo_fMapped = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "mcbh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'm':
                glo_fMapped ^= 1;
                break;
            case 'c':
                fCheck ^= 1;
                break;
            case 'b':
                fBarBufs ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // read the file using the corresponding file reader
    pNtk = Io_Read( pFileName, IO_FILE_VERILOG, fCheck, fBarBufs );
    if ( pNtk == NULL )
        return 1;
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_verilog [-mcbh] <file>\n" );
    fprintf( pAbc->Err, "\t         reads the network in Verilog (IWLS 2002/2005 subset)\n" );
    fprintf( pAbc->Err, "\t-m     : toggle reading mapped Verilog [default = %s]\n", glo_fMapped? "yes":"no" );
    fprintf( pAbc->Err, "\t-c     : toggle network check after reading [default = %s]\n", fCheck? "yes":"no" );
    fprintf( pAbc->Err, "\t-b     : toggle reading barrier buffers [default = %s]\n", fBarBufs? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\tfile   : the name of a file to read\n" );
    return 1;
}